

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

int N_VLinearCombinationVectorArray(int nvec,int nsum,realtype *c,N_Vector **X,N_Vector *Z)

{
  _func_int_int_int_realtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  N_Vector *__ptr;
  ulong uVar2;
  ulong uVar3;
  
  UNRECOVERED_JUMPTABLE = (*Z)->ops->nvlinearcombinationvectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_int_realtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0)
  {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,nsum,c,X,Z);
    return iVar1;
  }
  if ((*Z)->ops->nvlinearcombination == (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0) {
    if (0 < nvec) {
      uVar3 = 0;
      do {
        (*(*Z)->ops->nvscale)(*c,(*X)[uVar3],Z[uVar3]);
        if (1 < nsum) {
          uVar2 = 1;
          do {
            (*(*Z)->ops->nvlinearsum)(c[uVar2],X[uVar2][uVar3],1.0,Z[uVar3],Z[uVar3]);
            uVar2 = uVar2 + 1;
          } while ((uint)nsum != uVar2);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)nvec);
    }
    iVar1 = 0;
  }
  else {
    __ptr = (N_Vector *)malloc((long)nsum << 3);
    if (0 < nvec) {
      uVar3 = 0;
      do {
        if (0 < nsum) {
          uVar2 = 0;
          do {
            __ptr[uVar2] = X[uVar2][uVar3];
            uVar2 = uVar2 + 1;
          } while ((uint)nsum != uVar2);
        }
        iVar1 = (*(*Z)->ops->nvlinearcombination)(nsum,c,__ptr,Z[uVar3]);
        if (iVar1 != 0) goto LAB_004ffcdf;
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)nvec);
    }
    iVar1 = 0;
LAB_004ffcdf:
    free(__ptr);
  }
  return iVar1;
}

Assistant:

int N_VLinearCombinationVectorArray(int nvec, int nsum, realtype* c,
                                    N_Vector** X, N_Vector* Z)
{
  int i, j, ier;
  N_Vector* Y = NULL;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0][0]));

  if (Z[0]->ops->nvlinearcombinationvectorarray != NULL) {

    ier = Z[0]->ops->nvlinearcombinationvectorarray(nvec, nsum, c, X, Z);

  } else if (Z[0]->ops->nvlinearcombination != NULL ) {

    /* allocate array of vectors */
    Y = (N_Vector* ) malloc(nsum * sizeof(N_Vector));

    for (i=0; i<nvec; i++) {

      for (j=0; j<nsum; j++) {
        Y[j] = X[j][i];
      }

      ier = Z[0]->ops->nvlinearcombination(nsum, c, Y, Z[i]);
      if (ier != 0) break;
    }

    /* free array of vectors */
    free(Y);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvscale(c[0], X[0][i], Z[i]);
      for (j=1; j<nsum; j++) {
        Z[0]->ops->nvlinearsum(c[j], X[j][i], RCONST(1.0), Z[i], Z[i]);
      }
    }
    ier = 0;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0][0]));
  return(ier);
}